

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_RemoveTarget
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int flags;
  undefined8 *puVar1;
  PClassActor *filter;
  PClass *pPVar2;
  undefined8 uVar3;
  PClass *pPVar4;
  VMValue *pVVar5;
  VMValue *pVVar6;
  char *pcVar7;
  AActor *removetarget;
  bool bVar8;
  FName local_2c;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      puVar1 = (undefined8 *)(param->field_0).field_1.a;
      if (puVar1 != (undefined8 *)0x0) {
        if (puVar1[1] == 0) {
          uVar3 = (**(code **)*puVar1)(puVar1);
          puVar1[1] = uVar3;
        }
        pPVar4 = (PClass *)puVar1[1];
        bVar8 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar8) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar8 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar8) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003dfac1;
        }
      }
      if (numparam == 1) {
        pVVar5 = defaultparam->Array;
        if (defaultparam->Array[1].field_0.field_3.Type != '\0') {
          pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_003dfae0:
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1847,
                        "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
      }
      else {
        pVVar5 = param;
        if (param[1].field_0.field_3.Type != '\0') {
          pcVar7 = "(param[paramnum]).Type == REGT_INT";
          goto LAB_003dfae0;
        }
      }
      flags = pVVar5[1].field_0.i;
      if (numparam < 3) {
        pVVar5 = defaultparam->Array;
        if ((pVVar5[2].field_0.field_3.Type != '\x03') ||
           ((pVVar6 = pVVar5 + 2, pVVar5[2].field_0.field_1.atag != 1 &&
            ((pVVar6->field_0).field_1.a != (void *)0x0)))) {
          pcVar7 = 
          "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
          ;
          goto LAB_003dfaa2;
        }
      }
      else if ((param[2].field_0.field_3.Type != '\x03') ||
              ((pVVar6 = param + 2, param[2].field_0.field_1.atag != 1 &&
               ((pVVar6->field_0).field_1.a != (void *)0x0)))) {
        pcVar7 = 
        "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
        ;
LAB_003dfaa2:
        __assert_fail(pcVar7,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                      ,0x1848,
                      "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      filter = (PClassActor *)(pVVar6->field_0).field_1.a;
      if (numparam < 4) {
        param = defaultparam->Array;
        if (param[3].field_0.field_3.Type == '\0') goto LAB_003dfa2d;
        pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
      }
      else {
        if (param[3].field_0.field_3.Type == '\0') {
LAB_003dfa2d:
          if (puVar1[0x41] != 0) {
            if ((*(byte *)(puVar1[0x41] + 0x20) & 0x20) == 0) {
              local_2c.Index = param[3].field_0.i;
              removetarget = (AActor *)puVar1[0x41];
              if ((removetarget != (AActor *)0x0) &&
                 (((removetarget->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
                puVar1[0x41] = 0;
                removetarget = (AActor *)0x0;
              }
              DoRemove(removetarget,flags,filter,&local_2c);
            }
            else {
              puVar1[0x41] = 0;
            }
          }
          return 0;
        }
        pcVar7 = "(param[paramnum]).Type == REGT_INT";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1849,
                    "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003dfac1:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1846,
                "int AF_AActor_A_RemoveTarget(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_RemoveTarget)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT_DEF(flags);
	PARAM_CLASS_DEF(filter, AActor);
	PARAM_NAME_DEF(species);

	if (self->target != NULL)
	{
		DoRemove(self->target, flags, filter, species);
	}
	return 0;
}